

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> * __thiscall
google::protobuf::internal::cleanup::ChunkList::PeekForTesting
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,ChunkList *this)

{
  CleanupNode *pCVar1;
  CleanupNode *first;
  CleanupNode *it;
  Chunk *local_28;
  Chunk *c;
  ChunkList *this_local;
  vector<void_*,_std::allocator<void_*>_> *ret;
  
  std::vector<void_*,_std::allocator<void_*>_>::vector(__return_storage_ptr__);
  local_28 = this->head_;
  if (local_28 != (Chunk *)0x0) {
    first = this->next_ + -1;
    while( true ) {
      pCVar1 = Chunk::First(local_28);
      for (; pCVar1 <= first; first = first + -1) {
        std::vector<void_*,_std::allocator<void_*>_>::push_back(__return_storage_ptr__,&first->elem)
        ;
      }
      local_28 = local_28->next;
      if (local_28 == (Chunk *)0x0) break;
      first = Chunk::Last(local_28);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<void*> ChunkList::PeekForTesting() {
  std::vector<void*> ret;
  Chunk* c = head_;
  if (c == nullptr) return ret;
  // Iterate backwards to match destruction order.
  CleanupNode* it = next_ - 1;
  while (true) {
    CleanupNode* first = c->First();
    for (; it >= first; --it) {
      ret.push_back(it->elem);
    }
    c = c->next;
    if (c == nullptr) return ret;
    it = c->Last();
  };
}